

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspector.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  FUNCTION_RETURN FVar4;
  uint32_t uVar5;
  uint uVar6;
  ostream *poVar7;
  pointer pvVar8;
  reference __src;
  string *psVar9;
  void *pvVar10;
  ifstream license_file_1;
  string fname_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  declared_licenses;
  char *env_var_value;
  undefined1 auStack_808 [7];
  bool find_license_with_env_var;
  ifstream license_file;
  allocator local_5f9;
  undefined1 local_5f8 [8];
  string fname;
  DmiInfo dmi_info;
  CpuInfo cpu;
  int i;
  anon_struct_1044_5_0902c47b osAdapter;
  iterator __end2;
  iterator __begin2;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *__range2;
  undefined1 local_b8 [4];
  FUNCTION_RETURN ret;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> adapterInfos;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_98;
  LCC_API_CLOUD_PROVIDER local_8c;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_88;
  LCC_API_VIRTUALIZATION_SUMMARY local_7c;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_78;
  reference local_70;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *x;
  const_iterator __end1;
  const_iterator __begin1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  LCC_API_VIRTUALIZATION_SUMMARY local_48;
  ExecutionEnvironmentInfo exec_env_info;
  size_t bufSize;
  char hw_identifier [20];
  char **argv_local;
  int argc_local;
  
  exec_env_info.virtualization = 0x14;
  exec_env_info.virtualization_detail = BARE_TO_METAL;
  __end1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&stringByStrategyId_abi_cxx11_);
  x = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&stringByStrategyId_abi_cxx11_);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&x), bVar2) {
    local_70 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end1);
    bVar2 = identify_pc(local_70->first,(char *)&bufSize,(size_t *)&exec_env_info.virtualization,
                        (ExecutionEnvironmentInfo *)((long)&__range1 + 4));
    if (bVar2) {
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_70->second);
      poVar7 = std::operator<<(poVar7,':');
      poVar7 = std::operator<<(poVar7,(char *)&bufSize);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_70->second);
      poVar7 = std::operator<<(poVar7,": NA");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"Virtualiz. class :");
  local_7c = local_48;
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&descByVirt_abi_cxx11_,(key_type *)&local_7c);
  pvVar8 = std::__detail::
           _Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                         *)&local_78);
  poVar7 = std::operator<<(poVar7,(string *)&pvVar8->second);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Virtualiz. detail:");
  local_8c = exec_env_info.cloud_provider;
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&descByVirtDetail_abi_cxx11_,(key_type *)&local_8c);
  pvVar8 = std::__detail::
           _Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                         *)&local_88);
  poVar7 = std::operator<<(poVar7,(string *)&pvVar8->second);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Cloud provider   :");
  adapterInfos.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = __range1._4_4_;
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&descByCloudProvider_abi_cxx11_,
              (key_type *)
              ((long)&adapterInfos.
                      super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pvVar8 = std::__detail::
           _Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                         *)&local_98);
  poVar7 = std::operator<<(poVar7,(string *)&pvVar8->second);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::vector
            ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
             local_b8);
  FVar4 = license::os::getAdapterInfos
                    ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                      *)local_b8);
  if (FVar4 == FUNC_RET_OK) {
    __end2 = std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
             begin((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                    *)local_b8);
    osAdapter._1036_8_ =
         std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::end
                   ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                     *)local_b8);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<license::os::OsAdapterInfo_*,_std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>_>
                                       *)osAdapter.ipv4_address), bVar2) {
      __src = __gnu_cxx::
              __normal_iterator<license::os::OsAdapterInfo_*,_std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>_>
              ::operator*(&__end2);
      memcpy((void *)((long)&cpu.m_brand.field_2 + 0xc),__src,0x414);
      poVar7 = std::operator<<((ostream *)&std::cout,"Network adapter [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,cpu.m_brand.field_2._12_4_);
      poVar7 = std::operator<<(poVar7,"]: ");
      poVar7 = std::operator<<(poVar7,(char *)&i);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"   ip address [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)osAdapter.mac_address[1]);
      poVar7 = std::operator<<(poVar7,"-");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)osAdapter.mac_address[0]);
      poVar7 = std::operator<<(poVar7,"-");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)(byte)osAdapter.description[0x401]);
      poVar7 = std::operator<<(poVar7,"-");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)(byte)osAdapter.description[0x400]);
      poVar7 = std::operator<<(poVar7,"]");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"   mac address [");
      std::ostream::operator<<(poVar7,std::hex);
      for (cpu.m_brand.field_2._8_4_ = 0; (uint)cpu.m_brand.field_2._8_4_ < 6;
          cpu.m_brand.field_2._8_4_ = cpu.m_brand.field_2._8_4_ + 1) {
        if (cpu.m_brand.field_2._8_4_ != 0) {
          std::operator<<((ostream *)&std::cout,":");
        }
        std::ostream::operator<<
                  (&std::cout,(uint)osAdapter.mac_address[(long)(int)cpu.m_brand.field_2._8_4_ + -8]
                  );
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"]");
      pvVar10 = (void *)std::ostream::operator<<(poVar7,std::dec);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<license::os::OsAdapterInfo_*,_std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"problem in getting adapter informations:");
    pvVar10 = (void *)std::ostream::operator<<(poVar7,FVar4);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  }
  license::os::CpuInfo::CpuInfo((CpuInfo *)&dmi_info.m_cpu_cores);
  poVar7 = std::operator<<((ostream *)&std::cout,"Cpu Vendor       :");
  psVar9 = license::os::CpuInfo::vendor_abi_cxx11_((CpuInfo *)&dmi_info.m_cpu_cores);
  poVar7 = std::operator<<(poVar7,(string *)psVar9);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Cpu Brand        :");
  psVar9 = license::os::CpuInfo::brand_abi_cxx11_((CpuInfo *)&dmi_info.m_cpu_cores);
  poVar7 = std::operator<<(poVar7,(string *)psVar9);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Cpu hypervisor   :");
  bVar2 = license::os::CpuInfo::is_hypervisor_set((CpuInfo *)&dmi_info.m_cpu_cores);
  pvVar10 = (void *)std::ostream::operator<<(poVar7,bVar2);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Cpu model        :0x");
  pvVar10 = (void *)std::ostream::operator<<(poVar7,std::hex);
  uVar5 = license::os::CpuInfo::model((CpuInfo *)&dmi_info.m_cpu_cores);
  pvVar10 = (void *)std::ostream::operator<<(pvVar10,(ulong)uVar5);
  pvVar10 = (void *)std::ostream::operator<<(pvVar10,std::dec);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  license::os::DmiInfo::DmiInfo((DmiInfo *)((long)&fname.field_2 + 8));
  poVar7 = std::operator<<((ostream *)&std::cout,"Bios vendor      :");
  psVar9 = license::os::DmiInfo::bios_vendor_abi_cxx11_((DmiInfo *)((long)&fname.field_2 + 8));
  poVar7 = std::operator<<(poVar7,(string *)psVar9);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Bios description :");
  psVar9 = license::os::DmiInfo::bios_description_abi_cxx11_((DmiInfo *)((long)&fname.field_2 + 8));
  poVar7 = std::operator<<(poVar7,(string *)psVar9);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"System vendor    :");
  psVar9 = license::os::DmiInfo::sys_vendor_abi_cxx11_((DmiInfo *)((long)&fname.field_2 + 8));
  poVar7 = std::operator<<(poVar7,(string *)psVar9);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Cpu Vendor (dmi) :");
  psVar9 = license::os::DmiInfo::cpu_manufacturer_abi_cxx11_((DmiInfo *)((long)&fname.field_2 + 8));
  poVar7 = std::operator<<(poVar7,(string *)psVar9);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Cpu Cores  (dmi) :");
  uVar6 = license::os::DmiInfo::cpu_cores((DmiInfo *)((long)&fname.field_2 + 8));
  pvVar10 = (void *)std::ostream::operator<<(poVar7,uVar6);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"==================");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_5f8,pcVar1,&local_5f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    std::ifstream::ifstream(auStack_808,(string *)local_5f8,_S_in);
    bVar3 = std::ios::good();
    if ((bVar3 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"license file :");
      poVar7 = std::operator<<(poVar7,(string *)local_5f8);
      poVar7 = std::operator<<(poVar7," not found.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      verifyLicense((string *)local_5f8);
    }
    std::ifstream::~ifstream(auStack_808);
    std::__cxx11::string::~string((string *)local_5f8);
  }
  license::os::DmiInfo::~DmiInfo((DmiInfo *)((long)&fname.field_2 + 8));
  license::os::CpuInfo::~CpuInfo((CpuInfo *)&dmi_info.m_cpu_cores);
  std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::~vector
            ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
             local_b8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	char hw_identifier[LCC_API_PC_IDENTIFIER_SIZE + 1];
	size_t bufSize = LCC_API_PC_IDENTIFIER_SIZE + 1;
	ExecutionEnvironmentInfo exec_env_info;
	for (const auto& x : stringByStrategyId) {
		if (identify_pc(static_cast<LCC_API_HW_IDENTIFICATION_STRATEGY>(x.first), hw_identifier, &bufSize,
						&exec_env_info)) {
			std::cout << x.second << ':' << hw_identifier << std::endl;
		} else {
			std::cout << x.second << ": NA" << endl;
		}
	}
	cout << "Virtualiz. class :" << descByVirt.find(exec_env_info.virtualization)->second << endl;
	cout << "Virtualiz. detail:" << descByVirtDetail.find(exec_env_info.virtualization_detail)->second << endl;
	cout << "Cloud provider   :" << descByCloudProvider.find(exec_env_info.cloud_provider)->second << endl;

	std::vector<license::os::OsAdapterInfo> adapterInfos;
	FUNCTION_RETURN ret = license::os::getAdapterInfos(adapterInfos);
	if (ret == FUNCTION_RETURN::FUNC_RET_OK) {
		for (auto osAdapter : adapterInfos) {
			cout << "Network adapter [" << osAdapter.id << "]: " << osAdapter.description << endl;
			cout << "   ip address [" << static_cast<unsigned int>(osAdapter.ipv4_address[3]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[2]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[1]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[0]) << "]" << endl;
			cout << "   mac address [" << std::hex;
			for (int i = 0; i < sizeof(osAdapter.mac_address); i++) {
				if (i != 0) {
					cout << ":";
				}
				cout << static_cast<unsigned int>(osAdapter.mac_address[i]);
			}
			cout << "]" << std::dec << endl;
		}
	} else {
		cout << "problem in getting adapter informations:" << ret << endl;
	}

	license::os::CpuInfo cpu;
	cout << "Cpu Vendor       :" << cpu.vendor() << endl;
	cout << "Cpu Brand        :" << cpu.brand() << endl;
	cout << "Cpu hypervisor   :" << cpu.is_hypervisor_set() << endl;
	cout << "Cpu model        :0x" << std::hex << ((long)cpu.model()) << std::dec << endl;
	license::os::DmiInfo dmi_info;
	cout << "Bios vendor      :" << dmi_info.bios_vendor() << endl;
	cout << "Bios description :" << dmi_info.bios_description() << endl;
	cout << "System vendor    :" << dmi_info.sys_vendor() << endl;
	cout << "Cpu Vendor (dmi) :" << dmi_info.cpu_manufacturer() << endl;
	cout << "Cpu Cores  (dmi) :" << dmi_info.cpu_cores() << endl;
	cout << "==================" << endl;
	if (argc == 2) {
		const string fname(argv[1]);
		ifstream license_file(fname);
		if (license_file.good()) {
			verifyLicense(fname);
		} else {
			cerr << "license file :" << fname << " not found." << endl;
		}
	}
	bool find_license_with_env_var = FIND_LICENSE_WITH_ENV_VAR;
	if (find_license_with_env_var) {
		char* env_var_value = getenv(LCC_LICENSE_LOCATION_ENV_VAR);
		if (env_var_value != nullptr && env_var_value[0] != '\0') {
			cout << "environment variable [" << LCC_LICENSE_LOCATION_ENV_VAR << "] value [" << env_var_value << "]"
				 << endl;
			const vector<string> declared_licenses = license::split_string(string(env_var_value), ';');
			for (string fname : declared_licenses) {
				ifstream license_file(fname);
				if (license_file.good()) {
					verifyLicense(fname);
				} else {
					cerr << "license file :" << fname << " not found." << endl;
				}
			}
		} else {
			cout << "environment variable [" << LCC_LICENSE_LOCATION_ENV_VAR << "] configured but not defined." << endl;
		}
	}
}